

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::MapReflectionTester::ExpectMapFieldsSetViaReflectionIterator
          (MapReflectionTester *this,Message *message)

{
  undefined1 *this_00;
  EnumValueDescriptor *pEVar1;
  bool bVar2;
  Reflection *this_01;
  FieldDescriptor *pFVar3;
  char *pcVar4;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>_> piVar5;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>_> plVar6;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>_>
  puVar7;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>_>
  puVar8;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>_> pfVar9;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>_> pdVar10;
  reference pvVar11;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar12;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char>_>_>
  pbVar13;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>_>
  ppEVar14;
  MapValueConstRef *pMVar15;
  MapKey *pMVar16;
  Reflection *this_02;
  string_view sVar17;
  AssertHelper local_16a0;
  Message local_1698;
  int local_168c;
  undefined1 local_1688 [8];
  AssertionResult gtest_ar_35;
  Message local_1670;
  int32_t local_1668;
  int32_t local_1664;
  undefined1 local_1660 [8];
  AssertionResult gtest_ar_34;
  Message *sub_message;
  string local_1628;
  string_view local_1608;
  MapIterator local_15f8;
  string_view local_15b0;
  undefined1 local_15a0 [8];
  MapIterator iter_15;
  key_arg<int> local_1550;
  int size_2;
  undefined1 local_1548 [8];
  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  map_15;
  Message local_1520;
  int local_1514;
  int32_t local_1510;
  int local_150c;
  undefined1 local_1508 [8];
  AssertionResult gtest_ar_33;
  MapIterator local_14e8;
  string_view local_14a0;
  undefined1 local_1490 [8];
  MapIterator iter_14;
  undefined1 local_1440 [8];
  flat_hash_map<int,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  map_14;
  Message local_1418;
  string_view local_1410;
  int32_t local_13fc;
  undefined1 local_13f8 [8];
  AssertionResult gtest_ar_32;
  MapIterator local_13d8;
  string_view local_1390;
  undefined1 local_1380 [8];
  MapIterator iter_13;
  string local_1330 [36];
  key_arg<int> local_130c;
  string local_1308 [32];
  undefined1 local_12e8 [8];
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map_13;
  Message local_12c0;
  int local_12b4;
  undefined1 local_12b0 [8];
  AssertionResult gtest_ar_31;
  Message local_1298;
  string_view local_1290;
  string_view local_1280;
  undefined1 local_1270 [8];
  AssertionResult gtest_ar_30;
  string local_1240;
  string_view local_1220;
  MapIterator local_1210;
  string_view local_11c8;
  undefined1 local_11b8 [8];
  MapIterator iter_12;
  undefined1 local_1168 [4];
  int size_1;
  string local_1148 [32];
  key_arg<std::__cxx11::basic_string<char>_> local_1128;
  string local_1108 [32];
  undefined1 local_10e8 [8];
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map_12;
  Message local_10c0;
  bool local_10b1;
  undefined1 local_10b0 [8];
  AssertionResult gtest_ar_29;
  MapIterator local_1090;
  string_view local_1048;
  undefined1 local_1038 [8];
  MapIterator iter_11;
  array<bool,_2UL> map_11;
  Message local_fe0;
  double local_fd8;
  int32_t local_fcc;
  undefined1 local_fc8 [8];
  AssertionResult gtest_ar_28;
  MapIterator local_fa8;
  string_view local_f60;
  undefined1 local_f50 [8];
  MapIterator iter_10;
  undefined1 local_f00 [8];
  flat_hash_map<int,_double,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  map_10;
  Message local_ed8;
  float local_ed0;
  int32_t local_ecc;
  undefined1 local_ec8 [8];
  AssertionResult gtest_ar_27;
  MapIterator local_ea8;
  string_view local_e60;
  undefined1 local_e50 [8];
  MapIterator iter_9;
  undefined1 local_e00 [8];
  flat_hash_map<int,_float,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  map_9;
  Message local_dd8;
  int32_t local_dd0;
  int32_t local_dcc;
  undefined1 local_dc8 [8];
  AssertionResult gtest_ar_26;
  MapIterator local_da8;
  string_view local_d60;
  undefined1 local_d50 [8];
  MapIterator iter_8;
  undefined1 local_d00 [8];
  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  map_8;
  Message local_cd8;
  uint64_t local_cd0;
  uint64_t local_cc8;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar_25;
  MapIterator local_ca0;
  string_view local_c58;
  undefined1 local_c48 [8];
  MapIterator iter_7;
  key_arg<unsigned_long> local_bf8;
  undefined1 local_bf0 [8];
  flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  map_7;
  Message local_bc8;
  uint32_t local_bc0;
  uint32_t local_bbc;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar_24;
  MapIterator local_b98;
  string_view local_b50;
  undefined1 local_b40 [8];
  MapIterator iter_6;
  undefined1 local_af0 [8];
  flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  map_6;
  Message local_ac8;
  int64_t local_ac0;
  int64_t local_ab8;
  undefined1 local_ab0 [8];
  AssertionResult gtest_ar_23;
  MapIterator local_a90;
  string_view local_a48;
  undefined1 local_a38 [8];
  MapIterator iter_5;
  key_arg<long> local_9e8;
  undefined1 local_9e0 [8];
  flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
  map_5;
  Message local_9b8;
  int32_t local_9b0;
  int32_t local_9ac;
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar_22;
  MapIterator local_988;
  string_view local_940;
  undefined1 local_930 [8];
  MapIterator iter_4;
  undefined1 local_8e0 [8];
  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  map_4;
  Message local_8b8;
  uint64_t local_8b0;
  uint64_t local_8a8;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_21;
  MapIterator local_880;
  string_view local_838;
  undefined1 local_828 [8];
  MapIterator iter_3;
  key_arg<unsigned_long> local_7d8;
  undefined1 local_7d0 [8];
  flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  map_3;
  Message local_7a8;
  uint32_t local_7a0;
  uint32_t local_79c;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_20;
  MapIterator local_778;
  string_view local_730;
  undefined1 local_720 [8];
  MapIterator iter_2;
  undefined1 local_6d0 [8];
  flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  map_2;
  Message local_6a8;
  int64_t local_6a0;
  int64_t local_698;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_19;
  MapIterator local_670;
  string_view local_628;
  undefined1 local_618 [8];
  MapIterator iter_1;
  key_arg<long> local_5c8;
  undefined1 local_5c0 [8];
  flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
  map_1;
  Message local_598;
  int local_58c;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_18;
  Message local_570;
  int32_t local_568;
  int32_t local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_17;
  string local_530;
  string_view local_510;
  MapIterator local_500;
  string_view local_4b8;
  undefined1 local_4a8 [8];
  MapIterator iter;
  key_arg<int> local_458;
  int size;
  undefined1 local_450 [8];
  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  map;
  Message local_428;
  string_view local_420;
  int local_410 [2];
  undefined1 local_408 [8];
  AssertionResult gtest_ar_16;
  Message local_3f0;
  string_view local_3e8;
  int local_3d8 [2];
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_15;
  Message local_3b8;
  string_view local_3b0;
  int local_3a0 [2];
  undefined1 local_398 [8];
  AssertionResult gtest_ar_14;
  Message local_380;
  string_view local_378;
  int local_368 [2];
  undefined1 local_360 [8];
  AssertionResult gtest_ar_13;
  Message local_348;
  string_view local_340;
  int local_330 [2];
  undefined1 local_328 [8];
  AssertionResult gtest_ar_12;
  Message local_310;
  string_view local_308;
  int local_2f8 [2];
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_11;
  Message local_2d8;
  string_view local_2d0;
  int local_2c0 [2];
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_10;
  Message local_2a0;
  string_view local_298;
  int local_288 [2];
  undefined1 local_280 [8];
  AssertionResult gtest_ar_9;
  Message local_268;
  string_view local_260;
  int local_250 [2];
  undefined1 local_248 [8];
  AssertionResult gtest_ar_8;
  Message local_230;
  string_view local_228;
  int local_218 [2];
  undefined1 local_210 [8];
  AssertionResult gtest_ar_7;
  Message local_1f8;
  string_view local_1f0;
  int local_1e0 [2];
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_6;
  Message local_1c0;
  string_view local_1b8;
  int local_1a8 [2];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_5;
  Message local_188;
  string_view local_180;
  int local_170 [2];
  undefined1 local_168 [8];
  AssertionResult gtest_ar_4;
  Message local_150;
  string_view local_148;
  int local_138 [2];
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  Message local_118;
  string_view local_110;
  int local_100 [2];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  Message local_e0;
  string_view local_d8;
  int local_c8 [2];
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a8;
  Message local_a0;
  string_view local_98;
  int local_88 [2];
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  Reflection *reflection;
  string serialized;
  string scratch;
  Message *message_local;
  MapReflectionTester *this_local;
  
  std::__cxx11::string::string((string *)(serialized.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&reflection);
  this_01 = Message::GetReflection(message);
  local_88[1] = 2;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_98,"map_int32_int32");
  pFVar3 = F(this,local_98);
  local_88[0] = Reflection::FieldSize(this_01,message,pFVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_80,"2","reflection->FieldSize(*message, F(\"map_int32_int32\"))",
             local_88 + 1,local_88);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(&local_a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x56a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_c8[1] = 2;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_d8,"map_int64_int64");
    pFVar3 = F(this,local_d8);
    local_c8[0] = Reflection::FieldSize(this_01,message,pFVar3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_c0,"2","reflection->FieldSize(*message, F(\"map_int64_int64\"))",
               local_c8 + 1,local_c8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_e0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                 ,0x56b,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_e0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_100[1] = 2;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_110,"map_uint32_uint32");
      pFVar3 = F(this,local_110);
      local_100[0] = Reflection::FieldSize(this_01,message,pFVar3);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_f8,"2",
                 "reflection->FieldSize(*message, F(\"map_uint32_uint32\"))",local_100 + 1,local_100
                );
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
      if (!bVar2) {
        testing::Message::Message(&local_118);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                   ,0x56c,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_118);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_118);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_138[1] = 2;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_148,"map_uint64_uint64");
        pFVar3 = F(this,local_148);
        local_138[0] = Reflection::FieldSize(this_01,message,pFVar3);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_130,"2",
                   "reflection->FieldSize(*message, F(\"map_uint64_uint64\"))",local_138 + 1,
                   local_138);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
        if (!bVar2) {
          testing::Message::Message(&local_150);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                     ,0x56d,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_150);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_150);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_170[1] = 2;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_180,"map_sint32_sint32");
          pFVar3 = F(this,local_180);
          local_170[0] = Reflection::FieldSize(this_01,message,pFVar3);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_168,"2",
                     "reflection->FieldSize(*message, F(\"map_sint32_sint32\"))",local_170 + 1,
                     local_170);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
          if (!bVar2) {
            testing::Message::Message(&local_188);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                       ,0x56e,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_188);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_188);
          }
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
          if (gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_1a8[1] = 2;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_1b8,"map_sint64_sint64");
            pFVar3 = F(this,local_1b8);
            local_1a8[0] = Reflection::FieldSize(this_01,message,pFVar3);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_1a0,"2",
                       "reflection->FieldSize(*message, F(\"map_sint64_sint64\"))",local_1a8 + 1,
                       local_1a8);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar2) {
              testing::Message::Message(&local_1c0);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                         ,0x56f,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_1c0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_1c0);
            }
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            if (gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_1e0[1] = 2;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_1f0,"map_fixed32_fixed32");
              pFVar3 = F(this,local_1f0);
              local_1e0[0] = Reflection::FieldSize(this_01,message,pFVar3);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_1d8,"2",
                         "reflection->FieldSize(*message, F(\"map_fixed32_fixed32\"))",local_1e0 + 1
                         ,local_1e0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
              if (!bVar2) {
                testing::Message::Message(&local_1f8);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                           ,0x570,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_1f8);
              }
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
              if (gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_218[1] = 2;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_228,"map_fixed64_fixed64");
                pFVar3 = F(this,local_228);
                local_218[0] = Reflection::FieldSize(this_01,message,pFVar3);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_210,"2",
                           "reflection->FieldSize(*message, F(\"map_fixed64_fixed64\"))",
                           local_218 + 1,local_218);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_210);
                if (!bVar2) {
                  testing::Message::Message(&local_230);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                             ,0x571,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_230);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_230);
                }
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
                if (gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_250[1] = 2;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_260,"map_sfixed32_sfixed32");
                  pFVar3 = F(this,local_260);
                  local_250[0] = Reflection::FieldSize(this_01,message,pFVar3);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_248,"2",
                             "reflection->FieldSize(*message, F(\"map_sfixed32_sfixed32\"))",
                             local_250 + 1,local_250);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_248);
                  if (!bVar2) {
                    testing::Message::Message(&local_268);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_248)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                               ,0x572,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_268);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_268);
                  }
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
                  if (gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_288[1] = 2;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_298,"map_sfixed64_sfixed64");
                    pFVar3 = F(this,local_298);
                    local_288[0] = Reflection::FieldSize(this_01,message,pFVar3);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_280,"2",
                               "reflection->FieldSize(*message, F(\"map_sfixed64_sfixed64\"))",
                               local_288 + 1,local_288);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_280);
                    if (!bVar2) {
                      testing::Message::Message(&local_2a0);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_280);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                 ,0x573,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_2a0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_2a0);
                    }
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
                    if (gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_2c0[1] = 2;
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (&local_2d0,"map_int32_float");
                      pFVar3 = F(this,local_2d0);
                      local_2c0[0] = Reflection::FieldSize(this_01,message,pFVar3);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_2b8,"2",
                                 "reflection->FieldSize(*message, F(\"map_int32_float\"))",
                                 local_2c0 + 1,local_2c0);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_2b8);
                      if (!bVar2) {
                        testing::Message::Message(&local_2d8);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_2b8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                   ,0x574,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,&local_2d8);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(&local_2d8);
                      }
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar2;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                      if (gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_2f8[1] = 2;
                        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  (&local_308,"map_int32_double");
                        pFVar3 = F(this,local_308);
                        local_2f8[0] = Reflection::FieldSize(this_01,message,pFVar3);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_2f0,"2",
                                   "reflection->FieldSize(*message, F(\"map_int32_double\"))",
                                   local_2f8 + 1,local_2f8);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_2f0);
                        if (!bVar2) {
                          testing::Message::Message(&local_310);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_2f0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                     ,0x575,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,&local_310);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(&local_310);
                        }
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar2;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                        if (gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_330[1] = 2;
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    (&local_340,"map_bool_bool");
                          pFVar3 = F(this,local_340);
                          local_330[0] = Reflection::FieldSize(this_01,message,pFVar3);
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_328,"2",
                                     "reflection->FieldSize(*message, F(\"map_bool_bool\"))",
                                     local_330 + 1,local_330);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_328);
                          if (!bVar2) {
                            testing::Message::Message(&local_348);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_328);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                       ,0x576,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,&local_348);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(&local_348);
                          }
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar2;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
                          if (gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            local_368[1] = 2;
                            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                      (&local_378,"map_string_string");
                            pFVar3 = F(this,local_378);
                            local_368[0] = Reflection::FieldSize(this_01,message,pFVar3);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_360,"2",
                                       "reflection->FieldSize(*message, F(\"map_string_string\"))",
                                       local_368 + 1,local_368);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_360);
                            if (!bVar2) {
                              testing::Message::Message(&local_380);
                              pcVar4 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_360);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                         ,0x577,pcVar4);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_14.message_,&local_380);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_);
                              testing::Message::~Message(&local_380);
                            }
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar2;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_360)
                            ;
                            if (gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              local_3a0[1] = 2;
                              std::basic_string_view<char,_std::char_traits<char>_>::
                              basic_string_view(&local_3b0,"map_int32_bytes");
                              pFVar3 = F(this,local_3b0);
                              local_3a0[0] = Reflection::FieldSize(this_01,message,pFVar3);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_398,"2",
                                         "reflection->FieldSize(*message, F(\"map_int32_bytes\"))",
                                         local_3a0 + 1,local_3a0);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_398);
                              if (!bVar2) {
                                testing::Message::Message(&local_3b8);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_398);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                           ,0x578,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,&local_3b8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(&local_3b8);
                              }
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar2;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_398);
                              if (gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                local_3d8[1] = 2;
                                std::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view(&local_3e8,"map_int32_enum");
                                pFVar3 = F(this,local_3e8);
                                local_3d8[0] = Reflection::FieldSize(this_01,message,pFVar3);
                                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                          ((EqHelper *)local_3d0,"2",
                                           "reflection->FieldSize(*message, F(\"map_int32_enum\"))",
                                           local_3d8 + 1,local_3d8);
                                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_3d0);
                                if (!bVar2) {
                                  testing::Message::Message(&local_3f0);
                                  pcVar4 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_3d0);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                             ,0x579,pcVar4);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_16.message_,&local_3f0);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_);
                                  testing::Message::~Message(&local_3f0);
                                }
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar2;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_3d0);
                                if (gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  local_410[1] = 2;
                                  std::basic_string_view<char,_std::char_traits<char>_>::
                                  basic_string_view(&local_420,"map_int32_foreign_message");
                                  pFVar3 = F(this,local_420);
                                  local_410[0] = Reflection::FieldSize(this_01,message,pFVar3);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_408,"2",
                                             "reflection->FieldSize(*message, F(\"map_int32_foreign_message\"))"
                                             ,local_410 + 1,local_410);
                                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_408);
                                  if (!bVar2) {
                                    testing::Message::Message(&local_428);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_408);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)
                                               &map.
                                                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                .
                                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                .settings_.
                                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                .
                                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                .value.heap_or_soo_.heap.slot_array,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                               ,0x57a,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)
                                               &map.
                                                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                .
                                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                .settings_.
                                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                .
                                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                .value.heap_or_soo_.heap.slot_array,&local_428);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)
                                               &map.
                                                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                .
                                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                .settings_.
                                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                .
                                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                .value.heap_or_soo_.heap.slot_array);
                                    testing::Message::~Message(&local_428);
                                  }
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar2;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_408);
                                  if (gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    absl::lts_20250127::
                                    flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_450);
                                    size = 0;
                                    piVar5 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_450,&size);
                                    *piVar5 = 0;
                                    local_458 = 1;
                                    piVar5 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_450,&local_458);
                                    *piVar5 = 1;
                                    iter.value_.super_MapValueConstRef._12_4_ = 0;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_4b8,"map_int32_int32");
                                    pFVar3 = F(this,local_4b8);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_4a8,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view(&local_510,"map_int32_int32");
                                      pFVar3 = F(this,local_510);
                                      Reflection::MapEnd(&local_500,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_4a8,&local_500);
                                      if (!bVar2) break;
                                      Message::DebugString_abi_cxx11_(&local_530,message);
                                      std::__cxx11::string::~string((string *)&local_530);
                                      Message::ShortDebugString_abi_cxx11_
                                                ((string *)&gtest_ar_17.message_,message);
                                      std::__cxx11::string::~string((string *)&gtest_ar_17.message_)
                                      ;
                                      protobuf::MessageLite::SerializeToString
                                                (&message->super_MessageLite,(string *)&reflection);
                                      Message::SpaceUsedLong(message);
                                      (*(message->super_MessageLite)._vptr_MessageLite[3])();
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_4a8);
                                      local_564 = MapKey::GetInt32Value(pMVar16);
                                      piVar5 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                               ::
                                               operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_450,&local_564);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_4a8)
                                                 ->super_MapValueConstRef;
                                      local_568 = MapValueConstRef::GetInt32Value(pMVar15);
                                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                ((EqHelper *)local_560,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetInt32Value()",piVar5,
                                                 &local_568);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_560);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_570);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_560);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_18.message_,
                                                   kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x58b,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_18.message_,&local_570)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_18.message_);
                                        testing::Message::~Message(&local_570);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_560);
                                      MapIterator::operator++((MapIterator *)local_4a8);
                                      iter.value_.super_MapValueConstRef._12_4_ =
                                           iter.value_.super_MapValueConstRef._12_4_ + 1;
                                    }
                                    local_58c = 2;
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_588,"size","2",
                                               (int *)&iter.value_.super_MapValueConstRef.field_0xc,
                                               &local_58c);
                                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_588);
                                    if (!bVar2) {
                                      testing::Message::Message(&local_598);
                                      pcVar4 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_588);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)
                                                 &map_1.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                 ,0x58d,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)
                                                 &map_1.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_598);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)
                                                 &map_1.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                      testing::Message::~Message(&local_598);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_588);
                                    absl::lts_20250127::
                                    flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_450);
                                    absl::lts_20250127::
                                    flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_5c0);
                                    local_5c8 = 0;
                                    plVar6 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                             ::
                                             operator[]<long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_5c0,&local_5c8);
                                    *plVar6 = 0;
                                    iter_1.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    iter_1.value_.super_MapValueConstRef._12_4_ = 0;
                                    plVar6 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                             ::
                                             operator[]<long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_5c0,
                                                  (key_arg<long> *)
                                                  &iter_1.value_.super_MapValueConstRef.type_);
                                    *plVar6 = 1;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_628,"map_int64_int64");
                                    pFVar3 = F(this,local_628);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_618,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_19.message_,"map_int64_int64");
                                      pFVar3 = F(this,stack0xfffffffffffff980);
                                      Reflection::MapEnd(&local_670,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_618,&local_670);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_618);
                                      local_698 = MapKey::GetInt64Value(pMVar16);
                                      plVar6 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                               ::
                                               operator[]<long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_5c0,&local_698);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_618)
                                                 ->super_MapValueConstRef;
                                      local_6a0 = MapValueConstRef::GetInt64Value(pMVar15);
                                      testing::internal::EqHelper::Compare<long,_long,_nullptr>
                                                ((EqHelper *)local_690,
                                                 "map[iter.GetKey().GetInt64Value()]",
                                                 "iter.GetValueRef().GetInt64Value()",plVar6,
                                                 &local_6a0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_690);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_6a8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_690);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_2.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x596,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_2.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_6a8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_2.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_6a8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_690);
                                      MapIterator::operator++((MapIterator *)local_618);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_5c0);
                                    absl::lts_20250127::
                                    flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_6d0);
                                    iter_2.value_.super_MapValueConstRef._12_4_ = 0;
                                    puVar7 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                             ::
                                             operator[]<unsigned_int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_6d0,
                                                  (key_arg<unsigned_int> *)
                                                  &iter_2.value_.super_MapValueConstRef.field_0xc);
                                    *puVar7 = 0;
                                    iter_2.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    puVar7 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                             ::
                                             operator[]<unsigned_int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_6d0,
                                                  &iter_2.value_.super_MapValueConstRef.type_);
                                    *puVar7 = 1;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_730,"map_uint32_uint32");
                                    pFVar3 = F(this,local_730);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_720,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_20.message_,"map_uint32_uint32");
                                      pFVar3 = F(this,stack0xfffffffffffff878);
                                      Reflection::MapEnd(&local_778,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_720,&local_778);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_720);
                                      local_79c = MapKey::GetUInt32Value(pMVar16);
                                      puVar7 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                               ::
                                               operator[]<unsigned_int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_6d0,&local_79c);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_720)
                                                 ->super_MapValueConstRef;
                                      local_7a0 = MapValueConstRef::GetUInt32Value(pMVar15);
                                      testing::internal::EqHelper::
                                      Compare<unsigned_int,_unsigned_int,_nullptr>
                                                ((EqHelper *)local_798,
                                                 "map[iter.GetKey().GetUInt32Value()]",
                                                 "iter.GetValueRef().GetUInt32Value()",puVar7,
                                                 &local_7a0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_798);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_7a8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_798);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_3.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5a1,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_3.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_7a8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_3.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_7a8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_798);
                                      MapIterator::operator++((MapIterator *)local_720);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_6d0);
                                    absl::lts_20250127::
                                    flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_7d0);
                                    local_7d8 = 0;
                                    puVar8 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                             ::
                                             operator[]<unsigned_long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_7d0,&local_7d8);
                                    *puVar8 = 0;
                                    iter_3.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    iter_3.value_.super_MapValueConstRef._12_4_ = 0;
                                    puVar8 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                             ::
                                             operator[]<unsigned_long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_7d0,
                                                  (key_arg<unsigned_long> *)
                                                  &iter_3.value_.super_MapValueConstRef.type_);
                                    *puVar8 = 1;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_838,"map_uint64_uint64");
                                    pFVar3 = F(this,local_838);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_828,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_21.message_,"map_uint64_uint64");
                                      pFVar3 = F(this,stack0xfffffffffffff770);
                                      Reflection::MapEnd(&local_880,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_828,&local_880);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_828);
                                      local_8a8 = MapKey::GetUInt64Value(pMVar16);
                                      puVar8 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                               ::
                                               operator[]<unsigned_long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_7d0,&local_8a8);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_828)
                                                 ->super_MapValueConstRef;
                                      local_8b0 = MapValueConstRef::GetUInt64Value(pMVar15);
                                      testing::internal::EqHelper::
                                      Compare<unsigned_long,_unsigned_long,_nullptr>
                                                ((EqHelper *)local_8a0,
                                                 "map[iter.GetKey().GetUInt64Value()]",
                                                 "iter.GetValueRef().GetUInt64Value()",puVar8,
                                                 &local_8b0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_8a0);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_8b8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_8a0);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_4.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5ac,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_4.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_8b8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_4.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_8b8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_8a0);
                                      MapIterator::operator++((MapIterator *)local_828);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_7d0);
                                    absl::lts_20250127::
                                    flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_8e0);
                                    iter_4.value_.super_MapValueConstRef._12_4_ = 0;
                                    piVar5 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_8e0,
                                                  (key_arg<int> *)
                                                  &iter_4.value_.super_MapValueConstRef.field_0xc);
                                    *piVar5 = 0;
                                    iter_4.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    piVar5 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_8e0,
                                                  (key_arg<int> *)
                                                  &iter_4.value_.super_MapValueConstRef.type_);
                                    *piVar5 = 1;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_940,"map_sint32_sint32");
                                    pFVar3 = F(this,local_940);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_930,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_22.message_,"map_sint32_sint32");
                                      pFVar3 = F(this,stack0xfffffffffffff668);
                                      Reflection::MapEnd(&local_988,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_930,&local_988);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_930);
                                      local_9ac = MapKey::GetInt32Value(pMVar16);
                                      piVar5 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                               ::
                                               operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_8e0,&local_9ac);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_930)
                                                 ->super_MapValueConstRef;
                                      local_9b0 = MapValueConstRef::GetInt32Value(pMVar15);
                                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                ((EqHelper *)local_9a8,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetInt32Value()",piVar5,
                                                 &local_9b0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_9a8);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_9b8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_9a8);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_5.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5b7,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_5.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_9b8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_5.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_9b8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_9a8);
                                      MapIterator::operator++((MapIterator *)local_930);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_8e0);
                                    absl::lts_20250127::
                                    flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_9e0);
                                    local_9e8 = 0;
                                    plVar6 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                             ::
                                             operator[]<long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_9e0,&local_9e8);
                                    *plVar6 = 0;
                                    iter_5.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    iter_5.value_.super_MapValueConstRef._12_4_ = 0;
                                    plVar6 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                             ::
                                             operator[]<long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_9e0,
                                                  (key_arg<long> *)
                                                  &iter_5.value_.super_MapValueConstRef.type_);
                                    *plVar6 = 1;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_a48,"map_sint64_sint64");
                                    pFVar3 = F(this,local_a48);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_a38,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_23.message_,"map_sint64_sint64");
                                      pFVar3 = F(this,stack0xfffffffffffff560);
                                      Reflection::MapEnd(&local_a90,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_a38,&local_a90);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_a38);
                                      local_ab8 = MapKey::GetInt64Value(pMVar16);
                                      plVar6 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                               ::
                                               operator[]<long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<long,_long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_9e0,&local_ab8);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_a38)
                                                 ->super_MapValueConstRef;
                                      local_ac0 = MapValueConstRef::GetInt64Value(pMVar15);
                                      testing::internal::EqHelper::Compare<long,_long,_nullptr>
                                                ((EqHelper *)local_ab0,
                                                 "map[iter.GetKey().GetInt64Value()]",
                                                 "iter.GetValueRef().GetInt64Value()",plVar6,
                                                 &local_ac0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_ab0);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_ac8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_ab0);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_6.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5c2,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_6.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_ac8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_6.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_ac8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_ab0);
                                      MapIterator::operator++((MapIterator *)local_a38);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<long,_long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                                  *)local_9e0);
                                    absl::lts_20250127::
                                    flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_af0);
                                    iter_6.value_.super_MapValueConstRef._12_4_ = 0;
                                    puVar7 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                             ::
                                             operator[]<unsigned_int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_af0,
                                                  (key_arg<unsigned_int> *)
                                                  &iter_6.value_.super_MapValueConstRef.field_0xc);
                                    *puVar7 = 0;
                                    iter_6.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    puVar7 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                             ::
                                             operator[]<unsigned_int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_af0,
                                                  &iter_6.value_.super_MapValueConstRef.type_);
                                    *puVar7 = 1;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_b50,"map_fixed32_fixed32");
                                    pFVar3 = F(this,local_b50);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_b40,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_24.message_,"map_fixed32_fixed32");
                                      pFVar3 = F(this,stack0xfffffffffffff458);
                                      Reflection::MapEnd(&local_b98,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_b40,&local_b98);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_b40);
                                      local_bbc = MapKey::GetUInt32Value(pMVar16);
                                      puVar7 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                               ::
                                               operator[]<unsigned_int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_af0,&local_bbc);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_b40)
                                                 ->super_MapValueConstRef;
                                      local_bc0 = MapValueConstRef::GetUInt32Value(pMVar15);
                                      testing::internal::EqHelper::
                                      Compare<unsigned_int,_unsigned_int,_nullptr>
                                                ((EqHelper *)local_bb8,
                                                 "map[iter.GetKey().GetUInt32Value()]",
                                                 "iter.GetValueRef().GetUInt32Value()",puVar7,
                                                 &local_bc0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_bb8);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_bc8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_bb8);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_7.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5ce,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_7.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_bc8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_7.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_bc8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_bb8);
                                      MapIterator::operator++((MapIterator *)local_b40);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<unsigned_int,_unsigned_int,_absl::lts_20250127::hash_internal::Hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)local_af0);
                                    absl::lts_20250127::
                                    flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_bf0);
                                    local_bf8 = 0;
                                    puVar8 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                             ::
                                             operator[]<unsigned_long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_bf0,&local_bf8);
                                    *puVar8 = 0;
                                    iter_7.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    iter_7.value_.super_MapValueConstRef._12_4_ = 0;
                                    puVar8 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                             ::
                                             operator[]<unsigned_long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_bf0,
                                                  (key_arg<unsigned_long> *)
                                                  &iter_7.value_.super_MapValueConstRef.type_);
                                    *puVar8 = 1;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_c58,"map_fixed64_fixed64");
                                    pFVar3 = F(this,local_c58);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_c48,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_25.message_,"map_fixed64_fixed64");
                                      pFVar3 = F(this,stack0xfffffffffffff350);
                                      Reflection::MapEnd(&local_ca0,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_c48,&local_ca0);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_c48);
                                      local_cc8 = MapKey::GetUInt64Value(pMVar16);
                                      puVar8 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                               ::
                                               operator[]<unsigned_long,_absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_bf0,&local_cc8);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_c48)
                                                 ->super_MapValueConstRef;
                                      local_cd0 = MapValueConstRef::GetUInt64Value(pMVar15);
                                      testing::internal::EqHelper::
                                      Compare<unsigned_long,_unsigned_long,_nullptr>
                                                ((EqHelper *)local_cc0,
                                                 "map[iter.GetKey().GetUInt64Value()]",
                                                 "iter.GetValueRef().GetUInt64Value()",puVar8,
                                                 &local_cd0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_cc0);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_cd8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_cc0);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_8.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5da,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_8.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_cd8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_8.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_cd8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_cc0);
                                      MapIterator::operator++((MapIterator *)local_c48);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<unsigned_long,_unsigned_long,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                                  *)local_bf0);
                                    absl::lts_20250127::
                                    flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_d00);
                                    iter_8.value_.super_MapValueConstRef._12_4_ = 0;
                                    piVar5 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_d00,
                                                  (key_arg<int> *)
                                                  &iter_8.value_.super_MapValueConstRef.field_0xc);
                                    *piVar5 = 0;
                                    iter_8.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    piVar5 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_d00,
                                                  (key_arg<int> *)
                                                  &iter_8.value_.super_MapValueConstRef.type_);
                                    *piVar5 = 1;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_d60,"map_sfixed32_sfixed32");
                                    pFVar3 = F(this,local_d60);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_d50,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_26.message_,"map_sfixed32_sfixed32");
                                      pFVar3 = F(this,stack0xfffffffffffff248);
                                      Reflection::MapEnd(&local_da8,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_d50,&local_da8);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_d50);
                                      local_dcc = MapKey::GetInt32Value(pMVar16);
                                      piVar5 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                               ::
                                               operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_d00,&local_dcc);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_d50)
                                                 ->super_MapValueConstRef;
                                      local_dd0 = MapValueConstRef::GetInt32Value(pMVar15);
                                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                ((EqHelper *)local_dc8,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetInt32Value()",piVar5,
                                                 &local_dd0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_dc8);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_dd8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_dc8);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_9.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5e6,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_9.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_dd8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_9.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_dd8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_dc8);
                                      MapIterator::operator++((MapIterator *)local_d50);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_d00);
                                    absl::lts_20250127::
                                    flat_hash_map<int,_float,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<int,_float,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  *)local_e00);
                                    iter_9.value_.super_MapValueConstRef._12_4_ = 0;
                                    pfVar9 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  *)local_e00,
                                                  (key_arg<int> *)
                                                  &iter_9.value_.super_MapValueConstRef.field_0xc);
                                    *pfVar9 = 0.0;
                                    iter_9.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    pfVar9 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  *)local_e00,
                                                  (key_arg<int> *)
                                                  &iter_9.value_.super_MapValueConstRef.type_);
                                    *pfVar9 = 1.0;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_e60,"map_int32_float");
                                    pFVar3 = F(this,local_e60);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_e50,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_27.message_,"map_int32_float");
                                      pFVar3 = F(this,stack0xfffffffffffff148);
                                      Reflection::MapEnd(&local_ea8,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_e50,&local_ea8);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_e50);
                                      local_ecc = MapKey::GetInt32Value(pMVar16);
                                      pfVar9 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                               ::
                                               operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  *)local_e00,&local_ecc);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_e50)
                                                 ->super_MapValueConstRef;
                                      local_ed0 = MapValueConstRef::GetFloatValue(pMVar15);
                                      testing::internal::EqHelper::Compare<float,_float,_nullptr>
                                                ((EqHelper *)local_ec8,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetFloatValue()",pfVar9,
                                                 &local_ed0);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_ec8);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_ed8);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_ec8);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_10.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5f0,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_10.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_ed8);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_10.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_ed8);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_ec8);
                                      MapIterator::operator++((MapIterator *)local_e50);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<int,_float,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<int,_float,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                                                  *)local_e00);
                                    absl::lts_20250127::
                                    flat_hash_map<int,_double,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<int,_double,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  *)local_f00);
                                    iter_10.value_.super_MapValueConstRef._12_4_ = 0;
                                    pdVar10 = absl::lts_20250127::container_internal::
                                              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                              ::
                                              operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_nullptr>
                                                        ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  *)local_f00,
                                                  (key_arg<int> *)
                                                  &iter_10.value_.super_MapValueConstRef.field_0xc);
                                    *pdVar10 = 0.0;
                                    iter_10.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    pdVar10 = absl::lts_20250127::container_internal::
                                              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                              ::
                                              operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_nullptr>
                                                        ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  *)local_f00,
                                                  (key_arg<int> *)
                                                  &iter_10.value_.super_MapValueConstRef.type_);
                                    *pdVar10 = 1.0;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_f60,"map_int32_double");
                                    pFVar3 = F(this,local_f60);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_f50,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_28.message_,"map_int32_double");
                                      pFVar3 = F(this,stack0xfffffffffffff048);
                                      Reflection::MapEnd(&local_fa8,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_f50,&local_fa8);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_f50);
                                      local_fcc = MapKey::GetInt32Value(pMVar16);
                                      pdVar10 = absl::lts_20250127::container_internal::
                                                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                ::
                                                operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_nullptr>
                                                          ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_double>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  *)local_f00,&local_fcc);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_f50)
                                                 ->super_MapValueConstRef;
                                      local_fd8 = MapValueConstRef::GetDoubleValue(pMVar15);
                                      testing::internal::EqHelper::Compare<double,_double,_nullptr>
                                                ((EqHelper *)local_fc8,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetDoubleValue()",pdVar10,
                                                 &local_fd8);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_fc8);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_fe0);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_fc8);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&stack0xfffffffffffff018,
                                                   kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x5fb,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&stack0xfffffffffffff018,
                                                   &local_fe0);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&stack0xfffffffffffff018);
                                        testing::Message::~Message(&local_fe0);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_fc8);
                                      MapIterator::operator++((MapIterator *)local_f50);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<int,_double,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<int,_double,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                                                  *)local_f00);
                                    this_00 = &iter_11.value_.super_MapValueConstRef.field_0xe;
                                    pvVar11 = std::array<bool,_2UL>::operator[]
                                                        ((array<bool,_2UL> *)this_00,0);
                                    *pvVar11 = false;
                                    pvVar11 = std::array<bool,_2UL>::operator[]
                                                        ((array<bool,_2UL> *)this_00,1);
                                    *pvVar11 = true;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_1048,"map_bool_bool");
                                    pFVar3 = F(this,local_1048);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1038,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_29.message_,"map_bool_bool");
                                      pFVar3 = F(this,stack0xffffffffffffef60);
                                      Reflection::MapEnd(&local_1090,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_1038,&local_1090);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_1038);
                                      bVar2 = MapKey::GetBoolValue(pMVar16);
                                      pvVar11 = std::array<bool,_2UL>::operator[]
                                                          ((array<bool,_2UL> *)
                                                           &iter_11.value_.super_MapValueConstRef.
                                                            field_0xe,(ulong)bVar2);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_1038)
                                                 ->super_MapValueConstRef;
                                      local_10b1 = MapValueConstRef::GetBoolValue(pMVar15);
                                      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                                                ((EqHelper *)local_10b0,
                                                 "map[iter.GetKey().GetBoolValue() ? 1 : 0]",
                                                 "iter.GetValueRef().GetBoolValue()",pvVar11,
                                                 &local_10b1);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_10b0);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_10c0);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_10b0);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_12.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x605,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_12.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_10c0);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_12.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_10c0);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_10b0);
                                      MapIterator::operator++((MapIterator *)local_1038);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_10e8);
                                    long_string_abi_cxx11_();
                                    long_string_abi_cxx11_();
                                    pbVar12 = absl::lts_20250127::container_internal::
                                              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::
                                              operator[]<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                                                        ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_10e8,&local_1128);
                                    std::__cxx11::string::operator=((string *)pbVar12,local_1108);
                                    std::__cxx11::string::~string((string *)&local_1128);
                                    std::__cxx11::string::~string(local_1108);
                                    long_string_2_abi_cxx11_();
                                    long_string_2_abi_cxx11_();
                                    pbVar12 = absl::lts_20250127::container_internal::
                                              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::
                                              operator[]<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                                                        ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_10e8,
                                                  (key_arg<std::__cxx11::basic_string<char>_> *)
                                                  local_1168);
                                    std::__cxx11::string::operator=((string *)pbVar12,local_1148);
                                    std::__cxx11::string::~string((string *)local_1168);
                                    std::__cxx11::string::~string(local_1148);
                                    iter_12.value_.super_MapValueConstRef._12_4_ = 0;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_11c8,"map_string_string");
                                    pFVar3 = F(this,local_11c8);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_11b8,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view(&local_1220,"map_string_string");
                                      pFVar3 = F(this,local_1220);
                                      Reflection::MapEnd(&local_1210,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_11b8,&local_1210);
                                      if (!bVar2) break;
                                      Message::DebugString_abi_cxx11_(&local_1240,message);
                                      std::__cxx11::string::~string((string *)&local_1240);
                                      Message::ShortDebugString_abi_cxx11_
                                                ((string *)&gtest_ar_30.message_,message);
                                      std::__cxx11::string::~string((string *)&gtest_ar_30.message_)
                                      ;
                                      protobuf::MessageLite::SerializeToString
                                                (&message->super_MessageLite,(string *)&reflection);
                                      Message::SpaceUsedLong(message);
                                      (*(message->super_MessageLite)._vptr_MessageLite[3])();
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_11b8);
                                      sVar17 = MapKey::GetStringValue(pMVar16);
                                      local_1280 = sVar17;
                                      pbVar12 = absl::lts_20250127::container_internal::
                                                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ::
                                                operator[]<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                                                          ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_10e8,&local_1280);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_11b8)
                                                 ->super_MapValueConstRef;
                                      sVar17 = MapValueConstRef::GetStringValue(pMVar15);
                                      local_1290 = sVar17;
                                      testing::internal::EqHelper::
                                      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                                ((EqHelper *)local_1270,
                                                 "map[iter.GetKey().GetStringValue()]",
                                                 "iter.GetValueRef().GetStringValue()",pbVar12,
                                                 &local_1290);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_1270);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_1298);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_1270);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_31.message_,
                                                   kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x618,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_31.message_,&local_1298
                                                  );
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_31.message_);
                                        testing::Message::~Message(&local_1298);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_1270);
                                      MapIterator::operator++((MapIterator *)local_11b8);
                                      iter_12.value_.super_MapValueConstRef._12_4_ =
                                           iter_12.value_.super_MapValueConstRef._12_4_ + 1;
                                    }
                                    local_12b4 = 2;
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_12b0,"size","2",
                                               (int *)&iter_12.value_.super_MapValueConstRef.
                                                       field_0xc,&local_12b4);
                                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_12b0);
                                    if (!bVar2) {
                                      testing::Message::Message(&local_12c0);
                                      pcVar4 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_12b0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)
                                                 &map_13.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                 kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                 ,0x61a,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)
                                                 &map_13.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_12c0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)
                                                 &map_13.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                      testing::Message::~Message(&local_12c0);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_12b0);
                                    absl::lts_20250127::
                                    flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_10e8);
                                    absl::lts_20250127::
                                    flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_12e8);
                                    long_string_abi_cxx11_();
                                    local_130c = 0;
                                    pbVar13 = absl::lts_20250127::container_internal::
                                              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::
                                              operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                                                        ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_12e8,&local_130c);
                                    std::__cxx11::string::operator=((string *)pbVar13,local_1308);
                                    std::__cxx11::string::~string(local_1308);
                                    long_string_2_abi_cxx11_();
                                    iter_13.value_.super_MapValueConstRef._12_4_ = 1;
                                    pbVar13 = absl::lts_20250127::container_internal::
                                              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::
                                              operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                                                        ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_12e8,
                                                  (key_arg<int> *)
                                                  &iter_13.value_.super_MapValueConstRef.field_0xc);
                                    std::__cxx11::string::operator=((string *)pbVar13,local_1330);
                                    std::__cxx11::string::~string(local_1330);
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_1390,"map_int32_bytes");
                                    pFVar3 = F(this,local_1390);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1380,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_32.message_,"map_int32_bytes");
                                      pFVar3 = F(this,stack0xffffffffffffec18);
                                      Reflection::MapEnd(&local_13d8,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_1380,&local_13d8);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_1380);
                                      local_13fc = MapKey::GetInt32Value(pMVar16);
                                      pbVar13 = absl::lts_20250127::container_internal::
                                                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ::
                                                operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                                                          ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_12e8,&local_13fc);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_1380)
                                                 ->super_MapValueConstRef;
                                      sVar17 = MapValueConstRef::GetStringValue(pMVar15);
                                      local_1410 = sVar17;
                                      testing::internal::EqHelper::
                                      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                                                ((EqHelper *)local_13f8,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "iter.GetValueRef().GetStringValue()",pbVar13,
                                                 &local_1410);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_13f8);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_1418);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_13f8);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_14.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x623,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_14.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_1418);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_14.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_1418);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_13f8);
                                      MapIterator::operator++((MapIterator *)local_1380);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_12e8);
                                    absl::lts_20250127::
                                    flat_hash_map<int,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<int,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  *)local_1440);
                                    pEVar1 = this->map_enum_bar_;
                                    iter_14.value_.super_MapValueConstRef._12_4_ = 0;
                                    ppEVar14 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                               ::
                                               operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  *)local_1440,
                                                  (key_arg<int> *)
                                                  &iter_14.value_.super_MapValueConstRef.field_0xc);
                                    *ppEVar14 = pEVar1;
                                    pEVar1 = this->map_enum_baz_;
                                    iter_14.value_.super_MapValueConstRef.type_ = CPPTYPE_INT32;
                                    ppEVar14 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                               ::
                                               operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  *)local_1440,
                                                  (key_arg<int> *)
                                                  &iter_14.value_.super_MapValueConstRef.type_);
                                    *ppEVar14 = pEVar1;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_14a0,"map_int32_enum");
                                    pFVar3 = F(this,local_14a0);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_1490,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )&gtest_ar_33.message_,"map_int32_enum");
                                      pFVar3 = F(this,stack0xffffffffffffeb08);
                                      Reflection::MapEnd(&local_14e8,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_1490,&local_14e8);
                                      if (!bVar2) break;
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_1490);
                                      local_1510 = MapKey::GetInt32Value(pMVar16);
                                      ppEVar14 = absl::lts_20250127::container_internal::
                                                 raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                 ::
                                                 operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_nullptr>
                                                           ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  *)local_1440,&local_1510);
                                      local_150c = EnumValueDescriptor::number(*ppEVar14);
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_1490)
                                                 ->super_MapValueConstRef;
                                      local_1514 = MapValueConstRef::GetEnumValue(pMVar15);
                                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                ((EqHelper *)local_1508,
                                                 "map[iter.GetKey().GetInt32Value()]->number()",
                                                 "iter.GetValueRef().GetEnumValue()",&local_150c,
                                                 &local_1514);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_1508);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_1520);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_1508);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)
                                                   &map_15.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,
                                                  kNonFatalFailure,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x62d,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)
                                                   &map_15.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array,&local_1520);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)
                                                   &map_15.
                                                  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .
                                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  .settings_.
                                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                                  .
                                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                                  .value.heap_or_soo_.heap.slot_array);
                                        testing::Message::~Message(&local_1520);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_1508);
                                      MapIterator::operator++((MapIterator *)local_1490);
                                    }
                                    absl::lts_20250127::
                                    flat_hash_map<int,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<int,_const_google::protobuf::EnumValueDescriptor_*,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                                  *)local_1440);
                                    absl::lts_20250127::
                                    flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::flat_hash_map((
                                                  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_1548);
                                    size_2 = 0;
                                    piVar5 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_1548,&size_2);
                                    *piVar5 = 0;
                                    local_1550 = 1;
                                    piVar5 = absl::lts_20250127::container_internal::
                                             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                             ::
                                             operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                       ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_1548,&local_1550);
                                    *piVar5 = 1;
                                    iter_15.value_.super_MapValueConstRef._12_4_ = 0;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_15b0,"map_int32_foreign_message");
                                    pFVar3 = F(this,local_15b0);
                                    Reflection::MapBegin
                                              ((MapIterator *)local_15a0,this_01,message,pFVar3);
                                    while( true ) {
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view(&local_1608,"map_int32_foreign_message");
                                      pFVar3 = F(this,local_1608);
                                      Reflection::MapEnd(&local_15f8,this_01,message,pFVar3);
                                      bVar2 = protobuf::operator!=
                                                        ((MapIterator *)local_15a0,&local_15f8);
                                      if (!bVar2) break;
                                      Message::DebugString_abi_cxx11_(&local_1628,message);
                                      std::__cxx11::string::~string((string *)&local_1628);
                                      Message::ShortDebugString_abi_cxx11_
                                                ((string *)&sub_message,message);
                                      std::__cxx11::string::~string((string *)&sub_message);
                                      protobuf::MessageLite::SerializeToString
                                                (&message->super_MessageLite,(string *)&reflection);
                                      Message::SpaceUsedLong(message);
                                      (*(message->super_MessageLite)._vptr_MessageLite[3])();
                                      pMVar15 = &MapIterator::GetValueRef((MapIterator *)local_15a0)
                                                 ->super_MapValueConstRef;
                                      gtest_ar_34.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl =
                                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                            )MapValueConstRef::GetMessageValue(pMVar15);
                                      pMVar16 = MapIterator::GetKey((MapIterator *)local_15a0);
                                      local_1664 = MapKey::GetInt32Value(pMVar16);
                                      piVar5 = absl::lts_20250127::container_internal::
                                               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                               ::
                                               operator[]<int,_absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_nullptr>
                                                         ((
                                                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_1548,&local_1664);
                                      this_02 = Message::GetReflection
                                                          ((Message *)
                                                           gtest_ar_34.message_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                      local_1668 = Reflection::GetInt32
                                                             (this_02,(Message *)
                                                                      gtest_ar_34.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->foreign_c_);
                                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                ((EqHelper *)local_1660,
                                                 "map[iter.GetKey().GetInt32Value()]",
                                                 "sub_message.GetReflection()->GetInt32(sub_message, foreign_c_)"
                                                 ,piVar5,&local_1668);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_1660);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_1670);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_1660);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_35.message_,
                                                   kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                  ,0x641,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_35.message_,&local_1670
                                                  );
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_35.message_);
                                        testing::Message::~Message(&local_1670);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_1660);
                                      MapIterator::operator++((MapIterator *)local_15a0);
                                      iter_15.value_.super_MapValueConstRef._12_4_ =
                                           iter_15.value_.super_MapValueConstRef._12_4_ + 1;
                                    }
                                    local_168c = 2;
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_1688,"size","2",
                                               (int *)&iter_15.value_.super_MapValueConstRef.
                                                       field_0xc,&local_168c);
                                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_1688);
                                    if (!bVar2) {
                                      testing::Message::Message(&local_1698);
                                      pcVar4 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_1688);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_16a0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
                                                 ,0x643,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                (&local_16a0,&local_1698);
                                      testing::internal::AssertHelper::~AssertHelper(&local_16a0);
                                      testing::Message::~Message(&local_1698);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_1688);
                                    absl::lts_20250127::
                                    flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    ::~flat_hash_map((
                                                  flat_hash_map<int,_int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                  *)local_1548);
                                    gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ = 0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&reflection);
  std::__cxx11::string::~string((string *)(serialized.field_2._M_local_buf + 8));
  return;
}

Assistant:

void MapReflectionTester::ExpectMapFieldsSetViaReflectionIterator(
    Message* message) {
  std::string scratch;
  std::string serialized;
  const Reflection* reflection = message->GetReflection();

  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_int32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int64_int64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_uint32_uint32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_uint64_uint64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_sint32_sint32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_sint64_sint64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_fixed32_fixed32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_fixed64_fixed64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_sfixed32_sfixed32")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_sfixed64_sfixed64")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_float")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_double")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_bool_bool")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_string_string")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_bytes")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_enum")));
  ASSERT_EQ(2, reflection->FieldSize(*message, F("map_int32_foreign_message")));

  {
    absl::flat_hash_map<int32_t, int32_t> map;
    map[0] = 0;
    map[1] = 1;
    int size = 0;
    for (MapIterator iter = reflection->MapBegin(message, F("map_int32_int32"));
         iter != reflection->MapEnd(message, F("map_int32_int32"));
         ++iter, ++size) {
      // Check const methods do not invalidate map.
      message->DebugString();
      message->ShortDebugString();
      message->SerializeToString(&serialized);
      message->SpaceUsedLong();
      message->ByteSizeLong();
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetInt32Value());
    }
    EXPECT_EQ(size, 2);
  }
  {
    absl::flat_hash_map<int64_t, int64_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter = reflection->MapBegin(message, F("map_int64_int64"));
         iter != reflection->MapEnd(message, F("map_int64_int64")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt64Value()],
                iter.GetValueRef().GetInt64Value());
    }
  }
  {
    absl::flat_hash_map<uint32_t, uint32_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_uint32_uint32"));
         iter != reflection->MapEnd(message, F("map_uint32_uint32")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetUInt32Value()],
                iter.GetValueRef().GetUInt32Value());
    }
  }
  {
    absl::flat_hash_map<uint64_t, uint64_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_uint64_uint64"));
         iter != reflection->MapEnd(message, F("map_uint64_uint64")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetUInt64Value()],
                iter.GetValueRef().GetUInt64Value());
    }
  }
  {
    absl::flat_hash_map<int32_t, int32_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_sint32_sint32"));
         iter != reflection->MapEnd(message, F("map_sint32_sint32")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetInt32Value());
    }
  }
  {
    absl::flat_hash_map<int64_t, int64_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_sint64_sint64"));
         iter != reflection->MapEnd(message, F("map_sint64_sint64")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt64Value()],
                iter.GetValueRef().GetInt64Value());
    }
  }
  {
    absl::flat_hash_map<uint32_t, uint32_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_fixed32_fixed32"));
         iter != reflection->MapEnd(message, F("map_fixed32_fixed32"));
         ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetUInt32Value()],
                iter.GetValueRef().GetUInt32Value());
    }
  }
  {
    absl::flat_hash_map<uint64_t, uint64_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_fixed64_fixed64"));
         iter != reflection->MapEnd(message, F("map_fixed64_fixed64"));
         ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetUInt64Value()],
                iter.GetValueRef().GetUInt64Value());
    }
  }
  {
    absl::flat_hash_map<int32_t, int32_t> map;
    map[0] = 0;
    map[1] = 1;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_sfixed32_sfixed32"));
         iter != reflection->MapEnd(message, F("map_sfixed32_sfixed32"));
         ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetInt32Value());
    }
  }
  {
    absl::flat_hash_map<int32_t, float> map;
    map[0] = 0.0;
    map[1] = 1.0;
    for (MapIterator iter = reflection->MapBegin(message, F("map_int32_float"));
         iter != reflection->MapEnd(message, F("map_int32_float")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetFloatValue());
    }
  }
  {
    absl::flat_hash_map<int32_t, double> map;
    map[0] = 0.0;
    map[1] = 1.0;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_int32_double"));
         iter != reflection->MapEnd(message, F("map_int32_double")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetDoubleValue());
    }
  }
  {
    std::array<bool, 2> map;
    map[0] = false;
    map[1] = true;
    for (MapIterator iter = reflection->MapBegin(message, F("map_bool_bool"));
         iter != reflection->MapEnd(message, F("map_bool_bool")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetBoolValue() ? 1 : 0],
                iter.GetValueRef().GetBoolValue());
    }
  }
  {
    absl::flat_hash_map<std::string, std::string> map;
    map[long_string()] = long_string();
    map[long_string_2()] = long_string_2();
    int size = 0;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_string_string"));
         iter != reflection->MapEnd(message, F("map_string_string"));
         ++iter, ++size) {
      // Check const methods do not invalidate map.
      message->DebugString();
      message->ShortDebugString();
      message->SerializeToString(&serialized);
      message->SpaceUsedLong();
      message->ByteSizeLong();
      EXPECT_EQ(map[iter.GetKey().GetStringValue()],
                iter.GetValueRef().GetStringValue());
    }
    EXPECT_EQ(size, 2);
  }
  {
    absl::flat_hash_map<int32_t, std::string> map;
    map[0] = long_string();
    map[1] = long_string_2();
    for (MapIterator iter = reflection->MapBegin(message, F("map_int32_bytes"));
         iter != reflection->MapEnd(message, F("map_int32_bytes")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                iter.GetValueRef().GetStringValue());
    }
  }
  {
    absl::flat_hash_map<int32_t, const EnumValueDescriptor*> map;
    map[0] = map_enum_bar_;
    map[1] = map_enum_baz_;
    for (MapIterator iter = reflection->MapBegin(message, F("map_int32_enum"));
         iter != reflection->MapEnd(message, F("map_int32_enum")); ++iter) {
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()]->number(),
                iter.GetValueRef().GetEnumValue());
    }
  }
  {
    absl::flat_hash_map<int32_t, int32_t> map;
    map[0] = 0;
    map[1] = 1;
    int size = 0;
    for (MapIterator iter =
             reflection->MapBegin(message, F("map_int32_foreign_message"));
         iter != reflection->MapEnd(message, F("map_int32_foreign_message"));
         ++iter, ++size) {
      // Check const methods do not invalidate map.
      message->DebugString();
      message->ShortDebugString();
      message->SerializeToString(&serialized);
      message->SpaceUsedLong();
      message->ByteSizeLong();
      const Message& sub_message = iter.GetValueRef().GetMessageValue();
      EXPECT_EQ(map[iter.GetKey().GetInt32Value()],
                sub_message.GetReflection()->GetInt32(sub_message, foreign_c_));
    }
    EXPECT_EQ(size, 2);
  }
}